

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dirichlet.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
despot::Dirichlet::Next
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<double,_std::allocator<double>_> *alpha)

{
  size_type sVar1;
  reference pvVar2;
  double dVar3;
  int local_50;
  int local_4c;
  int i_1;
  int i;
  double sum;
  allocator<double> local_29;
  value_type_conflict3 local_28;
  undefined1 local_1d;
  int local_1c;
  vector<double,_std::allocator<double>_> *pvStack_18;
  int dim;
  vector<double,_std::allocator<double>_> *alpha_local;
  vector<double,_std::allocator<double>_> *x;
  
  pvStack_18 = alpha;
  alpha_local = __return_storage_ptr__;
  sVar1 = std::vector<double,_std::allocator<double>_>::size(alpha);
  local_1c = (int)sVar1;
  local_1d = 0;
  sVar1 = (size_type)local_1c;
  local_28 = 0.0;
  std::allocator<double>::allocator(&local_29);
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,sVar1,&local_28,&local_29);
  std::allocator<double>::~allocator(&local_29);
  _i_1 = 0.0;
  for (local_4c = 0; local_4c < local_1c; local_4c = local_4c + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](alpha,(long)local_4c);
    dVar3 = Gamma::Next(*pvVar2,1.0);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (__return_storage_ptr__,(long)local_4c);
    *pvVar2 = dVar3;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (__return_storage_ptr__,(long)local_4c);
    _i_1 = _i_1 + *pvVar2;
  }
  for (local_50 = 0; local_50 < local_1c; local_50 = local_50 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (__return_storage_ptr__,(long)local_50);
    dVar3 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (__return_storage_ptr__,(long)local_50);
    *pvVar2 = dVar3 / _i_1;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> Dirichlet::Next(vector<double> alpha) {
	int dim = alpha.size();
	vector<double> x(dim, 0);
	double sum = 0;
	for (int i = 0; i < dim; i++) {
		x[i] = Gamma::Next(alpha[i], 1);
		sum = sum + x[i];
	}
	for (int i = 0; i < dim; i++)
		x[i] = x[i] / sum;
	return x;
}